

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1cmap.c
# Opt level: O1

FT_Error t1_cmap_standard_init(T1_CMapStd cmap,FT_Pointer pointer)

{
  FT_Face pFVar1;
  long lVar2;
  
  pFVar1 = (cmap->cmap).charmap.face;
  lVar2 = pFVar1[3].num_glyphs;
  cmap->num_glyphs = *(FT_UInt *)&pFVar1[2].max_advance_width;
  cmap->glyph_names = (char **)pFVar1[2].glyph;
  cmap->sid_to_string = *(PS_Adobe_Std_StringsFunc *)(lVar2 + 0x28);
  cmap->code_to_sid = *(FT_UShort **)(lVar2 + 0x30);
  return 0;
}

Assistant:

static void
  t1_cmap_std_init( T1_CMapStd  cmap,
                    FT_Int      is_expert )
  {
    T1_Face             face    = (T1_Face)FT_CMAP_FACE( cmap );
    FT_Service_PsCMaps  psnames = (FT_Service_PsCMaps)face->psnames;


    cmap->num_glyphs    = (FT_UInt)face->type1.num_glyphs;
    cmap->glyph_names   = (const char* const*)face->type1.glyph_names;
    cmap->sid_to_string = psnames->adobe_std_strings;
    cmap->code_to_sid   = is_expert ? psnames->adobe_expert_encoding
                                    : psnames->adobe_std_encoding;

    FT_ASSERT( cmap->code_to_sid );
  }